

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config-c.cpp
# Opt level: O2

duckdb_state duckdb_get_config_flag(size_t index,char **out_name,char **out_description)

{
  ConfigurationOption *pCVar1;
  idx_t iVar2;
  char *pcVar3;
  long lVar4;
  optional_ptr<const_duckdb::ConfigurationOption,_true> option;
  
  option = duckdb::DBConfig::GetOptionByIndex(index);
  if (option.ptr == (ConfigurationOption *)0x0) {
    iVar2 = duckdb::DBConfig::GetOptionCount();
    if (0x3d < index - iVar2) {
      return DuckDBError;
    }
    lVar4 = (index - iVar2) * 0x60;
    if (out_name != (char **)0x0) {
      *out_name = "azure_account_name" + lVar4;
    }
    if (out_description == (char **)0x0) {
      return DuckDBSuccess;
    }
    pcVar3 = &UNK_02034070 + lVar4;
  }
  else {
    if (out_name != (char **)0x0) {
      pCVar1 = duckdb::optional_ptr<const_duckdb::ConfigurationOption,_true>::operator->(&option);
      *out_name = pCVar1->name;
    }
    if (out_description == (char **)0x0) {
      return DuckDBSuccess;
    }
    pCVar1 = duckdb::optional_ptr<const_duckdb::ConfigurationOption,_true>::operator->(&option);
    pcVar3 = pCVar1->description;
  }
  *out_description = pcVar3;
  return DuckDBSuccess;
}

Assistant:

duckdb_state duckdb_get_config_flag(size_t index, const char **out_name, const char **out_description) {
	auto option = DBConfig::GetOptionByIndex(index);
	if (option) {
		if (out_name) {
			*out_name = option->name;
		}
		if (out_description) {
			*out_description = option->description;
		}
		return DuckDBSuccess;
	}

	// extension index?
	auto entry = duckdb::ExtensionHelper::GetArrayEntry(duckdb::EXTENSION_SETTINGS, index - DBConfig::GetOptionCount());
	if (!entry) {
		return DuckDBError;
	}
	if (out_name) {
		*out_name = entry->name;
	}
	if (out_description) {
		*out_description = entry->extension;
	}
	return DuckDBSuccess;
}